

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

node * __thiscall
YAML::detail::node_data::get(node_data *this,node *key,shared_memory_holder *pMemory)

{
  bool bVar1;
  node_data *this_00;
  undefined8 uVar2;
  iterator this_01;
  iterator key_00;
  node *pnVar3;
  BadSubscript *in_RDX;
  shared_memory_holder *in_RDI;
  node *value;
  pair<YAML::detail::node_*,_YAML::detail::node_*> *it;
  iterator __end2;
  iterator __begin2;
  node_map *__range2;
  node *in_stack_ffffffffffffff88;
  node *in_stack_ffffffffffffff90;
  node *in_stack_ffffffffffffffb0;
  node *in_stack_ffffffffffffffd0;
  Mark *in_stack_ffffffffffffffd8;
  
  this_00 = (node_data *)
            (ulong)*(uint *)&in_RDI[1].
                             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
  switch(this_00) {
  case (node_data *)0x0:
  case (node_data *)0x1:
  case (node_data *)0x3:
    convert_to_map(this_00,in_RDI);
    break;
  case (node_data *)0x2:
    uVar2 = __cxa_allocate_exception(0x40);
    BadSubscript::BadSubscript<YAML::detail::node>
              (in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&BadSubscript::typeinfo,BadSubscript::~BadSubscript);
  case (node_data *)0x4:
  }
  this_01 = std::
            vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
            ::begin((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                     *)in_stack_ffffffffffffff88);
  key_00 = std::
           vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ::end((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                  *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      std::
      __shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xf09028);
      pnVar3 = memory_holder::create_node((memory_holder *)0xf09030);
      insert_map_pair((node_data *)this_01._M_current,(node *)key_00._M_current,
                      in_stack_ffffffffffffffb0);
      return pnVar3;
    }
    in_stack_ffffffffffffffb0 =
         (node *)__gnu_cxx::
                 __normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
                 ::operator*((__normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
                              *)&stack0xffffffffffffffc0);
    bVar1 = detail::node::is(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
    ::operator++((__normal_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  return (node *)(in_stack_ffffffffffffffb0->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
}

Assistant:

node& node_data::get(node& key, const shared_memory_holder& pMemory) {
  switch (m_type) {
    case NodeType::Map:
      break;
    case NodeType::Undefined:
    case NodeType::Null:
    case NodeType::Sequence:
      convert_to_map(pMemory);
      break;
    case NodeType::Scalar:
      throw BadSubscript(m_mark, key);
  }

  for (const auto& it : m_map) {
    if (it.first->is(key))
      return *it.second;
  }

  node& value = pMemory->create_node();
  insert_map_pair(key, value);
  return value;
}